

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

int __thiscall
QStyleSheetStyle::pixelMetric(QStyleSheetStyle *this,PixelMetric m,QStyleOption *opt,QWidget *w)

{
  Representation RVar1;
  QStyleSheetStyle *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QStyle *pQVar7;
  QSize QVar8;
  QSize QVar9;
  QObject *obj;
  long lVar10;
  int iVar11;
  long in_FS_OFFSET;
  QFontMetrics fm;
  QRenderRule subRule;
  QRenderRule rule;
  QRenderRule subRule_1;
  QSize local_1f0;
  QLatin1String local_1e8;
  QRenderRule local_1d8;
  QRenderRule local_150;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined1 *puStack_b0;
  long local_90;
  long local_80;
  long local_70;
  long local_60;
  long local_38;
  
  pQVar2 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar7 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))
                        (pQVar7,m,opt,w,*(code **)(*(long *)pQVar7 + 0xe0));
      return iVar5;
    }
    goto LAB_0036492a;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_150,0xaa,0x88);
  renderRule(&local_150,this,&w->super_QObject,opt,0);
  memset(&local_1d8,0xaa,0x88);
  QRenderRule::QRenderRule(&local_1d8);
  if (PM_ScrollView_ScrollBarOverlap < m) goto switchD_00363b66_caseD_6;
  iVar5 = 0x21;
  switch(m) {
  case PM_ButtonMargin:
  case PM_ButtonDefaultIndicator:
  case PM_ButtonShiftHorizontal:
  case PM_ButtonShiftVertical:
switchD_00363b66_caseD_0:
    if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00363b66_caseD_6;
LAB_0036417d:
    QVar8.wd.m_i = 0;
    QVar8.ht.m_i = 0;
    break;
  case PM_MenuButtonIndicator:
    lVar10 = QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    if (lVar10 == 0) {
      renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,7);
      QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
      QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    }
    else {
      QVar8.wd.m_i = 0;
      QVar8.ht.m_i = 0;
      if ((local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
          (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->
            d).ptr != (QStyleSheetBorderImageData *)0x0 ||
           (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native)))))) break;
      if ((opt == (QStyleOption *)0x0) || ((opt->version < 1 || (opt->type != 0xf0003))))
      goto switchD_00363b66_caseD_6;
      if ((opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i & 4) == 0) {
        iVar5 = 0x13;
      }
      else {
        iVar5 = 0x11;
      }
      renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,iVar5);
      QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
      QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    }
    if (((local_1d8.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((((QStyleSheetGeometryData *)local_1d8.geo.d.ptr)->width == -1 &&
         (((QStyleSheetGeometryData *)local_1d8.geo.d.ptr)->height == -1)))) &&
       ((local_1d8.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_1d8.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_1d8.img.d.ptr + 0x18))->m_i < 0))))))
    goto switchD_00363b66_caseD_6;
    QVar8 = QRenderRule::size(&local_1d8);
    break;
  case PM_DefaultFrameWidth:
    if ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native))))
    goto switchD_00363b66_caseD_6;
    QVar8.ht.m_i = 0;
    QVar8.wd.m_i = *(int *)((long)local_150.bd.d.ptr + 0x10);
    break;
  default:
    goto switchD_00363b66_caseD_6;
  case PM_ScrollBarExtent:
    if (((local_150.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)local_150.geo.d.ptr + 0xc) == -1 &&
         (*(int *)((long)local_150.geo.d.ptr + 0x10) == -1)))) &&
       ((local_150.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_150.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_150.img.d.ptr + 0x18))->m_i < 0))))))
    goto switchD_00363b66_caseD_6;
    QVar9 = QRenderRule::size(&local_150);
    QVar8 = (QSize)((ulong)QVar9 >> 0x20);
    if ((opt == (QStyleOption *)0x0) || ((opt->version < 1 || (opt->type != 0xf0001)))) {
LAB_00364883:
      bVar4 = QVar9.wd.m_i.m_i == -1;
    }
    else {
      bVar4 = opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i == 1;
    }
LAB_00364886:
    if (!bVar4) {
      QVar8 = QVar9;
    }
    QVar8 = (QSize)((ulong)QVar8 & 0xffffffff);
    break;
  case PM_ScrollBarSliderMin:
    bVar4 = hasStyleRule(this,&w->super_QObject,0x15);
    if (!bVar4) goto switchD_00363b66_caseD_6;
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x15);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (local_1d8.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
      local_c8.shared = (PrivateShared *)0x0;
    }
    else {
      local_c8.shared = (PrivateShared *)*(undefined8 *)((long)local_1d8.geo.d.ptr + 4);
    }
    QVar9 = QRenderRule::boxSize(&local_1d8,(QSize *)&local_c8.shared,7);
    QVar8 = (QSize)((ulong)QVar9 >> 0x20);
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 0xf0001))
    goto LAB_00364883;
    if (opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i == 1) {
      QVar8 = QVar9;
    }
    QVar8 = (QSize)((ulong)QVar8 & 0xffffffff);
    break;
  case PM_SliderThickness:
  case PM_SliderLength:
    if ((local_150.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
       ((*(int *)((long)local_150.geo.d.ptr + 0xc) == -1 &&
        (*(int *)((long)local_150.geo.d.ptr + 0x10) == -1)))) {
      if ((local_150.img.d.ptr == (QStyleSheetImageData *)0x0) ||
         (((((QSize *)((long)local_150.img.d.ptr + 0x14))->wd).m_i < 0 ||
          (((Representation *)((long)local_150.img.d.ptr + 0x18))->m_i < 0))))
      goto switchD_00363b66_caseD_6;
      bVar4 = -1 < (char)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                         super_QFlagsStorage<QStyle::StateFlag>.i;
      if (m == PM_SliderThickness) goto LAB_00364698;
      if (local_150.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
        QVar8.wd.m_i = 0;
        QVar8.ht.m_i = 0;
        break;
      }
    }
    else {
      bVar4 = ((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) == 0;
      if (m == PM_SliderThickness) {
LAB_00364698:
        QVar9 = QRenderRule::size(&local_150);
        QVar8 = (QSize)((ulong)QVar9 >> 0x20);
        bVar4 = !bVar4;
        goto LAB_00364886;
      }
    }
    QVar8 = *(QSize *)((long)local_150.geo.d.ptr + 4);
    if (bVar4) {
LAB_00363d4c:
      QVar8 = (QSize)((ulong)QVar8 >> 0x20);
    }
    break;
  case PM_SliderControlThickness:
    memset(&local_c8,0xaa,0x88);
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x32);
    if (((local_70 != 0) && ((*(int *)(local_70 + 0xc) != -1 || (*(int *)(local_70 + 0x10) != -1))))
       || ((local_60 != 0 && ((-1 < *(int *)(local_60 + 0x14) && (-1 < *(int *)(local_60 + 0x18)))))
          )) {
      QVar8 = QRenderRule::size((QRenderRule *)&local_c8);
      QVar8 = (QSize)((ulong)QVar8 >>
                     ((byte)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                            super_QFlagsStorage<QStyle::StateFlag>.i >> 2 & 0x20));
      goto LAB_00364835;
    }
LAB_003647a2:
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    goto switchD_00363b66_caseD_6;
  case PM_DockWidgetSeparatorExtent:
    memset(&local_c8,0xaa,0x88);
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x3d);
    if (((local_70 == 0) || ((*(int *)(local_70 + 0xc) == -1 && (*(int *)(local_70 + 0x10) == -1))))
       && ((local_60 == 0 || ((*(int *)(local_60 + 0x14) < 0 || (*(int *)(local_60 + 0x18) < 0))))))
    goto LAB_003647a2;
    QVar9 = QRenderRule::size((QRenderRule *)&local_c8);
    QVar8 = (QSize)((ulong)QVar9 >> 0x20);
    if (QVar9.ht.m_i.m_i < QVar9.wd.m_i.m_i) {
      QVar8 = (QSize)((ulong)QVar9 & 0xffffffff);
    }
    goto LAB_00364835;
  case PM_DockWidgetFrameWidth:
  case PM_ToolTipLabelFrameWidth:
    bVar4 = QRenderRule::hasDrawable(&local_150);
    if (bVar4) {
      iVar5 = 0;
      iVar11 = 0;
      if (local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
        iVar11 = *(int *)((long)local_150.bd.d.ptr + 0x10);
      }
      if (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        iVar5 = *(int *)((long)local_150.b.d.ptr + 0x20) + *(int *)((long)local_150.b.d.ptr + 0x10);
      }
      goto LAB_003646e4;
    }
    goto switchD_00363b66_caseD_6;
  case PM_TabBarTabHSpace:
  case PM_TabBarTabVSpace:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x2e);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (local_1d8.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_1d8.b.d.ptr != (QStyleSheetBoxData *)0x0) goto LAB_0036417d;
    goto switchD_00363b66_caseD_6;
  case PM_TabBarBaseOverlap:
    obj = (QObject *)QMetaObject::cast((QObject *)&QTabWidget::staticMetaObject);
    if (w != (QWidget *)0x0 && obj == (QObject *)0x0) {
      obj = *(QObject **)(*(long *)&w->field_0x8 + 0x10);
    }
    bVar4 = hasStyleRule(this,obj,0x36);
    if (bVar4) goto LAB_0036417d;
    goto switchD_00363b66_caseD_6;
  case PM_ProgressBarChunkWidth:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x2d);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (((local_1d8.geo.d.ptr != (QStyleSheetGeometryData *)0x0) &&
        ((*(int *)((long)local_1d8.geo.d.ptr + 0xc) != -1 ||
         (*(int *)((long)local_1d8.geo.d.ptr + 0x10) != -1)))) ||
       ((local_1d8.img.d.ptr != (QStyleSheetImageData *)0x0 &&
        ((-1 < (((QSize *)((long)local_1d8.img.d.ptr + 0x14))->wd).m_i &&
         (-1 < ((Representation *)((long)local_1d8.img.d.ptr + 0x18))->m_i)))))) {
      QVar9 = QRenderRule::size(&local_1d8);
      QVar8 = (QSize)((ulong)QVar9 >> 0x20);
      bVar4 = ((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) == 0;
      goto LAB_00364886;
    }
    goto switchD_00363b66_caseD_6;
  case PM_SplitterWidth:
    iVar5 = 0x20;
    goto switchD_00363b66_caseD_35;
  case PM_TitleBarHeight:
    memset(&local_c8,0xaa,0x88);
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x41);
    if (((local_70 == 0) || ((*(int *)(local_70 + 0xc) == -1 && (*(int *)(local_70 + 0x10) == -1))))
       && ((local_60 == 0 || ((*(int *)(local_60 + 0x14) < 0 || (*(int *)(local_60 + 0x18) < 0))))))
    {
      if (local_80 == 0 && local_90 == 0) goto LAB_003647a2;
      local_1e8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      if (opt == (QStyleOption *)0x0) {
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_1e8,&w->data->fnt);
      }
      else {
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_1e8,&opt->fontMetrics);
      }
      local_1f0.ht.m_i = QFontMetrics::height();
      local_1f0.wd.m_i = 0;
      QVar8 = QRenderRule::size((QRenderRule *)&local_c8,&local_1f0);
      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_1e8);
    }
    else {
      QVar8 = QRenderRule::size((QRenderRule *)&local_c8);
    }
    QVar8 = (QSize)((ulong)QVar8 >> 0x20);
    goto LAB_00364835;
  case PM_MenuScrollerHeight:
  case PM_MenuTearoffHeight:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,
               (m == PM_MenuTearoffHeight) + 0x23);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (((local_1d8.geo.d.ptr != (QStyleSheetGeometryData *)0x0) &&
        ((*(int *)((long)local_1d8.geo.d.ptr + 0xc) != -1 ||
         (*(int *)((long)local_1d8.geo.d.ptr + 0x10) != -1)))) ||
       ((local_1d8.img.d.ptr != (QStyleSheetImageData *)0x0 &&
        ((-1 < (((QSize *)((long)local_1d8.img.d.ptr + 0x14))->wd).m_i &&
         (-1 < ((Representation *)((long)local_1d8.img.d.ptr + 0x18))->m_i)))))) {
      QVar8 = QRenderRule::size(&local_1d8);
      goto LAB_00363d4c;
    }
    goto switchD_00363b66_caseD_6;
  case PM_MenuHMargin:
  case PM_MenuBarHMargin:
    if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00363b66_caseD_6;
    QVar8.ht.m_i = 0;
    QVar8.wd.m_i = *(int *)((long)local_150.b.d.ptr + 0x20);
    break;
  case PM_MenuVMargin:
  case PM_MenuBarVMargin:
    if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00363b66_caseD_6;
    QVar8.ht.m_i = 0;
    QVar8.wd.m_i = *(int *)((long)local_150.b.d.ptr + 0x14);
    break;
  case PM_MenuPanelWidth:
  case PM_MenuBarPanelWidth:
    if (local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
      iVar5 = 0;
      if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00363b66_caseD_6;
    }
    else {
      iVar5 = *(int *)((long)local_150.bd.d.ptr + 0x10);
      if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) {
LAB_003640da:
        iVar11 = 0;
        goto LAB_003646e4;
      }
    }
    iVar11 = *(int *)((long)local_150.b.d.ptr + 0x10);
    goto LAB_003646e4;
  case PM_MenuBarItemSpacing:
  case PM_ToolBarItemSpacing:
  case PM_RadioButtonLabelSpacing:
LAB_00364644:
    if (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar8.ht.m_i = 0;
      QVar8.wd.m_i = ((QStyleSheetBoxData *)local_150.b.d.ptr)->spacing;
      goto LAB_00364651;
    }
    goto switchD_00363b66_caseD_6;
  case PM_IndicatorWidth:
  case PM_IndicatorHeight:
  case PM_ExclusiveIndicatorWidth:
  case PM_ExclusiveIndicatorHeight:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,5);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (((local_1d8.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)local_1d8.geo.d.ptr + 0xc) == -1 &&
         (*(int *)((long)local_1d8.geo.d.ptr + 0x10) == -1)))) &&
       ((local_1d8.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_1d8.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_1d8.img.d.ptr + 0x18))->m_i < 0))))))
    goto switchD_00363b66_caseD_6;
    QVar8 = QRenderRule::size(&local_1d8);
    if ((m & ~PM_MenuButtonIndicator) != PM_IndicatorWidth) goto LAB_00363d4c;
    break;
  case PM_MdiSubWindowFrameWidth:
    if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0 &&
        local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) goto switchD_00363b66_caseD_6;
    iVar11 = 0;
    iVar5 = 0;
    if (local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
      iVar5 = *(int *)((long)local_150.bd.d.ptr + 0x10);
    }
    if (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      iVar11 = *(int *)((long)local_150.b.d.ptr + 0x10) + *(int *)((long)local_150.b.d.ptr + 0x20);
    }
    QVar8.wd.m_i = iVar11 + iVar5;
    QVar8.ht.m_i = 0;
    break;
  case PM_MdiSubWindowMinimizedWidth:
    memset(&local_c8,0xaa,0x88);
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,0,0x800000000);
    QVar8 = QRenderRule::size((QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
LAB_00364651:
    if (QVar8.wd.m_i.m_i == -1) goto switchD_00363b66_caseD_6;
    break;
  case PM_TabBarTabShiftHorizontal:
  case PM_TabBarTabShiftVertical:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x2e);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (local_1d8.b.d.ptr != (QStyleSheetBoxData *)0x0) goto LAB_0036417d;
    goto switchD_00363b66_caseD_6;
  case PM_TabBarScrollButtonWidth:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x2f);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (((local_1d8.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)local_1d8.geo.d.ptr + 0xc) == -1 &&
         (*(int *)((long)local_1d8.geo.d.ptr + 0x10) == -1)))) &&
       ((local_1d8.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_1d8.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_1d8.img.d.ptr + 0x18))->m_i < 0))))))
    goto switchD_00363b66_caseD_6;
    QVar8 = QRenderRule::size(&local_1d8);
    RVar1.m_i = QVar8.ht.m_i.m_i;
    if (QVar8.wd.m_i.m_i != -1) {
      RVar1.m_i = QVar8.wd.m_i.m_i;
    }
    QVar8.wd.m_i = RVar1.m_i / 2;
    QVar8.ht.m_i = 0;
    break;
  case PM_ToolBarFrameWidth:
    if (local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
      iVar5 = 0;
      if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00363b66_caseD_6;
    }
    else {
      iVar5 = *(int *)((long)local_150.bd.d.ptr + 0x10);
      if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto LAB_003640da;
    }
    iVar11 = *(int *)((long)local_150.b.d.ptr + 0x20);
LAB_003646e4:
    QVar8.wd.m_i = iVar5 + iVar11;
    QVar8.ht.m_i = 0;
    break;
  case PM_ToolBarHandleExtent:
    goto switchD_00363b66_caseD_35;
  case PM_ToolBarItemMargin:
  case PM_DockWidgetTitleBarButtonMargin:
    if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00363b66_caseD_6;
    QVar8.ht.m_i = 0;
    QVar8.wd.m_i = *(int *)((long)local_150.b.d.ptr + 4);
    break;
  case PM_ToolBarSeparatorExtent:
    iVar5 = 0x22;
switchD_00363b66_caseD_35:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,iVar5);
    QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    if (((local_1d8.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)local_1d8.geo.d.ptr + 0xc) == -1 &&
         (*(int *)((long)local_1d8.geo.d.ptr + 0x10) == -1)))) &&
       ((local_1d8.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_1d8.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_1d8.img.d.ptr + 0x18))->m_i < 0))))))
    goto switchD_00363b66_caseD_6;
    QVar9 = QRenderRule::size(&local_1d8);
    QVar8 = (QSize)((ulong)QVar9 >> 0x20);
    if ((opt != (QStyleOption *)0x0) &&
       (((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) != 0)) {
      QVar8 = (QSize)((ulong)QVar9 & 0xffffffff);
    }
    break;
  case PM_ToolBarIconSize:
  case PM_ListViewIconSize:
  case PM_IconViewIconSize:
  case PM_SmallIconSize:
  case PM_TabBarIconSize:
  case PM_MessageBoxIconSize:
  case PM_ButtonIconSize:
    local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_1e8.m_size = 9;
    local_1e8.m_data = "icon-size";
    QHash<QString,_QVariant>::value<QLatin1String,_true>
              ((QVariant *)&local_c8,&local_150.styleHints,&local_1e8);
    if ((puStack_b0 < (undefined1 *)0x4) ||
       (cVar3 = QMetaType::canConvert
                          ((QMetaTypeInterface *)((ulong)puStack_b0 & 0xfffffffffffffffc),
                           (QMetaTypeInterface *)
                           &QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType), cVar3 == '\0'))
    {
      ::QVariant::~QVariant((QVariant *)&local_c8);
      goto switchD_00363b66_caseD_6;
    }
    QVar8 = (QSize)::QVariant::toSize();
    ::QVariant::~QVariant((QVariant *)&local_c8);
    break;
  case PM_CheckBoxLabelSpacing:
    lVar10 = QMetaObject::cast((QObject *)&QCheckBox::staticMetaObject);
    if (((lVar10 == 0) || (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0)) ||
       (QVar8.ht.m_i = 0, QVar8.wd.m_i = *(int *)((long)local_150.b.d.ptr + 0x24),
       *(int *)((long)local_150.b.d.ptr + 0x24) == 0xffffffff)) {
      renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0xf);
      QRenderRule::operator=(&local_1d8,(QRenderRule *)&local_c8);
      QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
      local_150.b.d.ptr = local_1d8.b.d.ptr;
      goto LAB_00364644;
    }
    break;
  case PM_DockWidgetTitleMargin:
    memset(&local_c8,0xaa,0x88);
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x3a);
    if (local_90 == 0) goto LAB_003647a2;
    if (local_80 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)(local_80 + 4);
    }
    QVar8.wd.m_i = iVar5 + *(int *)(local_90 + 4) + *(int *)(local_90 + 0x14);
    QVar8.ht.m_i = 0;
LAB_00364835:
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    break;
  case PM_ScrollView_ScrollBarSpacing:
    if (local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) goto switchD_00363b66_caseD_0;
    QVar8.wd.m_i = 0;
    QVar8.ht.m_i = 0;
    QVar9.wd.m_i = 0;
    QVar9.ht.m_i = 0;
    if ((((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d)
          .ptr != (QStyleSheetBorderImageData *)0x0) ||
        (QVar8 = QVar9, *(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native)) ||
       (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0)) break;
switchD_00363b66_caseD_6:
    pQVar7 = baseStyle(this);
    uVar6 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,m,opt,w);
    QVar8.ht.m_i = 0;
    QVar8.wd.m_i = uVar6;
    break;
  case PM_ScrollView_ScrollBarOverlap:
    pQVar7 = QStyle::proxy((QStyle *)
                           ((long)&switchD_00363b66::switchdataD_0066f9b0 +
                           (long)(int)(&switchD_00363b66::switchdataD_0066f9b0)[m]));
    QVar8.wd.m_i = 0;
    QVar8.ht.m_i = 0;
    iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x60,opt,w,0);
    if (iVar5 != 0) goto switchD_00363b66_caseD_6;
  }
  QRenderRule::~QRenderRule(&local_1d8);
  QRenderRule::~QRenderRule(&local_150);
  if (pQVar2 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)QVar8.wd.m_i;
  }
LAB_0036492a:
  __stack_chk_fail();
}

Assistant:

int QStyleSheetStyle::pixelMetric(PixelMetric m, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->pixelMetric(m, opt, w))

    QRenderRule rule = renderRule(w, opt);
    QRenderRule subRule;

    switch (m) {
    case PM_MenuButtonIndicator:
#if QT_CONFIG(toolbutton)
        // QToolButton adds this directly to the width
        if (qobject_cast<const QToolButton *>(w)) {
            if (rule.hasBox() || !rule.hasNativeBorder())
                return 0;
            if (const auto *tbOpt = qstyleoption_cast<const QStyleOptionToolButton*>(opt)) {
                if (tbOpt->features & QStyleOptionToolButton::MenuButtonPopup)
                    subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                else
                    subRule = renderRule(w, opt, PseudoElement_ToolButtonMenuIndicator);
                if (subRule.hasContentsSize())
                    return subRule.size().width();
            }
            break;
        }
#endif
        subRule = renderRule(w, opt, PseudoElement_PushButtonMenuIndicator);
        if (subRule.hasContentsSize())
            return subRule.size().width();
        break;

    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:
    case PM_ButtonMargin:
    case PM_ButtonDefaultIndicator:
        if (rule.hasBox())
            return 0;
        break;

    case PM_DefaultFrameWidth:
        if (!rule.hasNativeBorder())
            return rule.border()->borders[LeftEdge];
        break;

    case PM_ExclusiveIndicatorWidth:
    case PM_IndicatorWidth:
    case PM_ExclusiveIndicatorHeight:
    case PM_IndicatorHeight:
        subRule = renderRule(w, opt, PseudoElement_Indicator);
        if (subRule.hasContentsSize()) {
            return (m == PM_ExclusiveIndicatorWidth) || (m == PM_IndicatorWidth)
                        ? subRule.size().width() : subRule.size().height();
        }
        break;

    case PM_DockWidgetFrameWidth:
    case PM_ToolTipLabelFrameWidth: // border + margin + padding (support only one width)
        if (!rule.hasDrawable())
            break;

        return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                + (rule.hasBox() ? rule.box()->margins[LeftEdge] + rule.box()->paddings[LeftEdge]: 0);

    case PM_ToolBarFrameWidth:
        if (rule.hasBorder() || rule.hasBox())
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->paddings[LeftEdge]: 0);
        break;

    case PM_MenuPanelWidth:
    case PM_MenuBarPanelWidth:
        if (rule.hasBorder() || rule.hasBox())
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->margins[LeftEdge]: 0);
        break;


    case PM_MenuHMargin:
    case PM_MenuBarHMargin:
        if (rule.hasBox())
            return rule.box()->paddings[LeftEdge];
        break;

    case PM_MenuVMargin:
    case PM_MenuBarVMargin:
        if (rule.hasBox())
            return rule.box()->paddings[TopEdge];
        break;

    case PM_DockWidgetTitleBarButtonMargin:
    case PM_ToolBarItemMargin:
        if (rule.hasBox())
            return rule.box()->margins[TopEdge];
        break;

    case PM_ToolBarItemSpacing:
    case PM_MenuBarItemSpacing:
        if (rule.hasBox() && rule.box()->spacing != -1)
            return rule.box()->spacing;
        break;

    case PM_MenuTearoffHeight:
    case PM_MenuScrollerHeight: {
        PseudoElement ps = m == PM_MenuTearoffHeight ? PseudoElement_MenuTearoff : PseudoElement_MenuScroller;
        subRule = renderRule(w, opt, ps);
        if (subRule.hasContentsSize())
            return subRule.size().height();
        break;
                                }

    case PM_ToolBarExtensionExtent:
        break;

    case PM_SplitterWidth:
    case PM_ToolBarSeparatorExtent:
    case PM_ToolBarHandleExtent: {
        PseudoElement ps;
        if (m == PM_ToolBarHandleExtent) ps = PseudoElement_ToolBarHandle;
        else if (m == PM_SplitterWidth) ps = PseudoElement_SplitterHandle;
        else ps = PseudoElement_ToolBarSeparator;
        subRule = renderRule(w, opt, ps);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (opt && opt->state & QStyle::State_Horizontal) ? sz.width() : sz.height();
        }
        break;
                                 }

    case PM_RadioButtonLabelSpacing:
        if (rule.hasBox() && rule.box()->spacing != -1)
            return rule.box()->spacing;
        break;
    case PM_CheckBoxLabelSpacing:
#if QT_CONFIG(checkbox)
        if (qobject_cast<const QCheckBox *>(w)) {
            if (rule.hasBox() && rule.box()->spacing != -1)
                return rule.box()->spacing;
        }
#endif
        // assume group box
        subRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
        if (subRule.hasBox() && subRule.box()->spacing != -1)
            return subRule.box()->spacing;
        break;

#if QT_CONFIG(scrollbar)
    case PM_ScrollBarExtent:
        if (rule.hasContentsSize()) {
            QSize sz = rule.size();
            if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt))
                return sb->orientation == Qt::Horizontal ? sz.height() : sz.width();
            return sz.width() == -1 ? sz.height() : sz.width();
        }
        break;

    case PM_ScrollBarSliderMin:
        if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
            subRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
            QSize msz = subRule.minimumSize();
            if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt))
                return sb->orientation == Qt::Horizontal ? msz.width() : msz.height();
            return msz.width() == -1 ? msz.height() : msz.width();
        }
        break;

    case PM_ScrollView_ScrollBarSpacing:
        if (!rule.hasNativeBorder() || rule.hasBox())
            return 0;
        break;

    case PM_ScrollView_ScrollBarOverlap:
        if (!proxy()->styleHint(SH_ScrollBar_Transient, opt, w))
            return 0;
        break;
#endif // QT_CONFIG(scrollbar)


    case PM_ProgressBarChunkWidth:
        subRule = renderRule(w, opt, PseudoElement_ProgressBarChunk);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (opt->state & QStyle::State_Horizontal)
                   ? sz.width() : sz.height();
        }
        break;

#if QT_CONFIG(tabwidget)
    case PM_TabBarTabHSpace:
    case PM_TabBarTabVSpace:
        subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || subRule.hasBorder())
            return 0;
        break;

    case PM_TabBarScrollButtonWidth:
        subRule = renderRule(w, opt, PseudoElement_TabBarScroller);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (sz.width() != -1 ? sz.width() : sz.height()) / 2;
        }
        break;

    case PM_TabBarTabShiftHorizontal:
    case PM_TabBarTabShiftVertical:
        subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox())
            return 0;
        break;

    case PM_TabBarBaseOverlap: {
        const QWidget *tabWidget = qobject_cast<const QTabWidget *>(w);
        if (!tabWidget && w)
            tabWidget = w->parentWidget();
        if (hasStyleRule(tabWidget, PseudoElement_TabWidgetPane)) {
            return 0;
        }
        break;
    }
#endif // QT_CONFIG(tabwidget)

    case PM_SliderThickness: // horizontal slider's height (sizeHint)
    case PM_SliderLength: // minimum length of slider
        if (rule.hasContentsSize()) {
            bool horizontal = opt->state & QStyle::State_Horizontal;
            if (m == PM_SliderThickness) {
                QSize sz = rule.size();
                return horizontal ? sz.height() : sz.width();
            } else {
                QSize msz = rule.minimumContentsSize();
                return horizontal ? msz.width() : msz.height();
            }
        }
        break;

    case PM_SliderControlThickness: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderHandle);
        if (!subRule.hasContentsSize())
            break;
        QSize size = subRule.size();
        return (opt->state & QStyle::State_Horizontal) ? size.height() : size.width();
                                    }

    case PM_ToolBarIconSize:
    case PM_ListViewIconSize:
    case PM_IconViewIconSize:
    case PM_TabBarIconSize:
    case PM_MessageBoxIconSize:
    case PM_ButtonIconSize:
    case PM_SmallIconSize: {
        const auto styleHint = rule.styleHint("icon-size"_L1);
        if (styleHint.isValid() && styleHint.canConvert<QSize>())
            return styleHint.toSize().width();
        break;
    }
    case PM_DockWidgetTitleMargin: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        if (!subRule.hasBox())
            break;
        return (subRule.border() ? subRule.border()->borders[TopEdge] : 0)
                + (subRule.hasBox() ? subRule.box()->margins[TopEdge] + subRule.box()->paddings[TopEdge]: 0);
                                   }

    case PM_DockWidgetSeparatorExtent: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetSeparator);
        if (!subRule.hasContentsSize())
            break;
        QSize sz = subRule.size();
        return qMax(sz.width(), sz.height());
                                        }

    case PM_TitleBarHeight: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
        if (subRule.hasContentsSize())
            return subRule.size().height();
        else if (subRule.hasBox() || subRule.hasBorder()) {
            QFontMetrics fm = opt ?  opt->fontMetrics : w->fontMetrics();
            return subRule.size(QSize(0, fm.height())).height();
        }
        break;
                            }

    case PM_MdiSubWindowFrameWidth:
        if (rule.hasBox() || rule.hasBorder()) {
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->paddings[LeftEdge]+rule.box()->margins[LeftEdge]: 0);
        }
        break;

    case PM_MdiSubWindowMinimizedWidth: {
        QRenderRule subRule = renderRule(w, PseudoElement_None, PseudoClass_Minimized);
        int width = subRule.size().width();
        if (width != -1)
            return width;
        break;
                                     }
    default:
        break;
    }

    return baseStyle()->pixelMetric(m, opt, w);
}